

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

void bf_write_buffer(bfile_t *bfile)

{
  ulong uVar1;
  size_t sVar2;
  long in_RDI;
  size_t bufpos;
  size_t res;
  size_t towrite;
  size_t written;
  ulong local_10;
  
  uVar1 = *(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x20);
  local_10 = 0;
  while (local_10 < uVar1) {
    sVar2 = fwrite((void *)(*(long *)(in_RDI + 0x30) +
                            *(ulong *)(in_RDI + 0x20) % (ulong)*(uint *)(in_RDI + 0x38) + local_10),
                   1,uVar1 - local_10,*(FILE **)(in_RDI + 8));
    if (sVar2 == 0) {
      fprintf(_stderr,"Error: fwrite() returned 0.\n");
    }
    else {
      local_10 = sVar2 + local_10;
    }
  }
  *(ulong *)(in_RDI + 0x20) = local_10 + *(long *)(in_RDI + 0x20);
  return;
}

Assistant:

static
void
bf_write_buffer(
    bfile_t * bfile )
{
    size_t written, towrite;

    assert( bfile != NULL );
    assert( bfile->file != NULL );
    assert( (bfile->flags & BF_WRITABLE) != FALSE );

    towrite = bfile->pos - bfile->ipos;
    written = 0;
    while ( written < towrite ) {
        size_t res, bufpos;
        bufpos = bfile->ipos % bfile->buffer_size;
        res = fwrite( bfile->buffer + bufpos + written, 1, 
                      towrite - written, bfile->file );
        if ( res != 0 ) {
            written += res;
        } else {
            fprintf( stderr, "Error: fwrite() returned 0.\n" );
        }
    }

    bfile->ipos += written;
}